

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ircode.c
# Opt level: O3

uint8_t opcode_numop(opcode_t op)

{
  if (op < (RESERVED6|HALT)) {
    return (&DAT_00144940)[op];
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_ircode.c"
                ,0x105,"uint8_t opcode_numop(opcode_t)");
}

Assistant:

uint8_t opcode_numop (opcode_t op) {
    switch (op) {
        case HALT: return 0;
        case NOP: return 0;
        case RET0: return 0;
        case RET: return 1;
        case CALL: return 3;
        case SETLIST: return 3;
        case LOADK: return 2;
        case LOADG: return 2;
        case LOADI: return 2;
        case LOADAT: return 3;
        case LOADS: return 3;
        case LOAD: return 3;
        case LOADU: return 2;
        case MOVE: return 2;
        case STOREG: return 2;
        case STOREAT: return 3;
        case STORE: return 3;
        case STOREU: return 2;
        case JUMP: return 1;
        case JUMPF: return 2;
        case SWITCH: return 1;
        case ADD: return 3;
        case SUB: return 3;
        case DIV: return 3;
        case MUL: return 3;
        case REM: return 3;
        case AND: return 3;
        case OR: return 3;
        case LT: return 3;
        case GT: return 3;
        case EQ: return 3;
        case ISA: return 3;
        case MATCH: return 3;
        case EQQ: return 3;
        case LEQ: return 3;
        case GEQ: return 3;
        case NEQ: return 3;
        case NEQQ: return 3;
        case NEG: return 2;
        case NOT: return 2;
        case LSHIFT: return 3;
        case RSHIFT: return 3;
        case BAND: return 3;
        case BOR: return 3;
        case BXOR: return 3;
        case BNOT: return 2;
        case MAPNEW: return 2;
        case LISTNEW: return 2;
        case RANGENEW: return 3;
        case CLOSURE: return 2;
        case CLOSE: return 1;
        case CHECK: return 1;
        case RESERVED2:
        case RESERVED3:
        case RESERVED4:
        case RESERVED5:
        case RESERVED6: return 0;
    }

    assert(0);
    return 0;
}